

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsize.h
# Opt level: O0

QSize operator/(QSize *s,qreal c)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QSize::width((QSize *)0x3ed50b);
  iVar2 = QtPrivate::qSaturateRound<double,_true>
                    ((double)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  QSize::height((QSize *)0x3ed52c);
  QtPrivate::qSaturateRound<double,_true>((double)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
  QSize::QSize((QSize *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc,
               in_stack_ffffffffffffffc8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

friend inline QSize operator/(const QSize &s, qreal c)
    {
        Q_ASSERT(!qFuzzyIsNull(c));
        return QSize(QtPrivate::qSaturateRound(s.width() / c), QtPrivate::qSaturateRound(s.height() / c));
    }